

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void __thiscall QRingBuffer::clear(QRingBuffer *this)

{
  QArrayData *data;
  iterator iVar1;
  iterator aend;
  
  if ((this->buffers).d.size != 0) {
    iVar1 = QList<QRingChunk>::begin(&this->buffers);
    aend = QList<QRingChunk>::end(&this->buffers);
    QList<QRingChunk>::erase(&this->buffers,iVar1.i + 1,(const_iterator)aend.i);
    iVar1 = QList<QRingChunk>::begin(&this->buffers);
    data = &(((iVar1.i)->chunk).d.d)->super_QArrayData;
    ((iVar1.i)->chunk).d.size = 0;
    (iVar1.i)->headOffset = 0;
    ((iVar1.i)->chunk).d.d = (Data *)0x0;
    ((iVar1.i)->chunk).d.ptr = (char *)0x0;
    (iVar1.i)->tailOffset = 0;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,1,0x10);
      }
    }
    this->bufferSize = 0;
  }
  return;
}

Assistant:

constexpr bool isEmpty() const noexcept { return size() == 0; }